

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

bool ON_String::IsPossibleEncoding(Encoding encoding,char *buffer,int buffer_length)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  size_t slen;
  ulong uVar7;
  int iVar8;
  ON_Big5CodePoint big5_cp;
  int db_count;
  ON_Big5CodePoint local_3a;
  uint local_38;
  int local_34;
  
  if (buffer != (char *)0x0 && Unknown < encoding) {
    uVar7 = (ulong)(uint)buffer_length;
    if (buffer_length == -1) {
      uVar7 = 0;
      do {
        if (buffer[uVar7] == '\0') goto LAB_005c22bf;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x7ffffffd);
      uVar7 = 0x7ffffffd;
    }
LAB_005c22bf:
    iVar6 = (int)uVar7;
    if (iVar6 == 0) {
      return true;
    }
    if (-1 < iVar6) {
      switch(encoding) {
      case ASCII:
        if (-1 < *buffer) {
          uVar1 = 1;
          do {
            uVar4 = uVar1;
            if ((uVar7 & 0xffffffff) == uVar4) break;
            uVar1 = uVar4 + 1;
          } while (-1 < buffer[uVar4]);
          return (uVar7 & 0xffffffff) <= uVar4;
        }
        break;
      case UTF8:
      case SloppyUTF8:
        bVar2 = ON_IsUTF8Encoded(SUB81(buffer,0),(char *)(uVar7 & 0xffffffff),buffer_length);
        return bVar2;
      case BIG5andASCII:
        uVar7 = 0;
        iVar8 = 0;
        local_34 = 0;
        do {
          bVar2 = true;
          iVar5 = 1;
          if (buffer[iVar8] < '\0') {
            if (iVar6 < iVar8 + 2) {
              bVar2 = false;
            }
            else {
              local_38 = (uint)uVar7;
              local_3a.m_big5_code_point = ON_Big5CodePoint::Error.m_big5_code_point;
              bVar2 = false;
              pcVar3 = ON_Big5CodePoint::Decode(buffer + iVar8,2,false,false,&local_3a);
              iVar5 = 1;
              if (pcVar3 == buffer + iVar8 + 2) {
                bVar2 = ON_Big5CodePoint::IsValid(&local_3a,false,false);
                iVar5 = 1;
                if (bVar2) {
                  local_34 = local_34 + 1;
                  iVar5 = 2;
                }
                uVar7 = (ulong)local_38;
              }
              else {
                uVar7 = (ulong)local_38;
              }
            }
          }
          if (!bVar2) break;
          iVar8 = iVar8 + iVar5;
          uVar7 = CONCAT71((int7)(uVar7 >> 8),iVar6 <= iVar8);
        } while (iVar8 < iVar6);
        return (bool)(0 < local_34 & (byte)uVar7);
      }
    }
  }
  return false;
}

Assistant:

bool ON_String::IsPossibleEncoding(
  ON_String::Encoding encoding,
  const char* buffer,
  int buffer_length
)
{
  // In practice, this is used to choose between BIG5 and UTF when parsing strings that
  // are names of components.
  // 
  // If you need something more clever like NOTPOAD++ encoding detection, then you need
  // to find a library that uses some sampling and linguistic analysis.
  if (ON_String::Encoding::Unset == encoding)
    return false;
  if (ON_String::Encoding::Unknown == encoding)
    return false;
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (0 == buffer_length)
    return true;
  if (buffer_length < 0)
    return false;

  switch (encoding)
  {
  case ON_String::Encoding::ASCII:
    return ON_IsASCIIEncoded(buffer, buffer_length);
  case ON_String::Encoding::UTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  case ON_String::Encoding::BIG5andASCII:
    return ON_IsBig5Encoded(buffer, buffer_length);
  case ON_String::Encoding::SloppyUTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  default:
    break;
  }

  return false;
}